

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::setTags(TestCaseInfo *testCaseInfo,
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *tags)

{
  SpecialProperties SVar1;
  SpecialProperties SVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  string lcaseTag;
  ostringstream oss;
  string local_1d0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b0;
  ostringstream local_1a8 [376];
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(testCaseInfo->tags)._M_t,&tags->_M_t);
  local_1b0 = &testCaseInfo->lcaseTags;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_1b0->_M_t,
             (_Link_type)
             (testCaseInfo->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  p_Var5 = &(testCaseInfo->lcaseTags)._M_t._M_impl.super__Rb_tree_header;
  (testCaseInfo->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (testCaseInfo->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var5->_M_header;
  (testCaseInfo->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var5->_M_header;
  (testCaseInfo->lcaseTags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  p_Var4 = (tags->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(tags->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
      toLower(&local_1d0,(string *)(p_Var4 + 1));
      SVar1 = testCaseInfo->properties;
      SVar2 = parseSpecialTag(&local_1d0);
      testCaseInfo->properties = SVar2 | SVar1;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_unique(&local_1b0->_M_t,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&testCaseInfo->tagsAsString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void setTags( TestCaseInfo& testCaseInfo, std::set<std::string> const& tags )
    {
        testCaseInfo.tags = tags;
        testCaseInfo.lcaseTags.clear();

        std::ostringstream oss;
        for( std::set<std::string>::const_iterator it = tags.begin(), itEnd = tags.end(); it != itEnd; ++it ) {
            oss << "[" << *it << "]";
            std::string lcaseTag = toLower( *it );
            testCaseInfo.properties = static_cast<TestCaseInfo::SpecialProperties>( testCaseInfo.properties | parseSpecialTag( lcaseTag ) );
            testCaseInfo.lcaseTags.insert( lcaseTag );
        }
        testCaseInfo.tagsAsString = oss.str();
    }